

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void bc_error_print(bc_error_t *err,char *prefix)

{
  bc_error_type_t bVar1;
  char *__format;
  
  if (err != (bc_error_t *)0x0) {
    if (prefix != (char *)0x0) {
      fprintf(_stderr,"%s: ",prefix);
    }
    bVar1 = err->type;
    switch(bVar1) {
    case BLOGC_ERROR_SOURCE_PARSER:
      __format = "error: source: %s\n";
      break;
    case BLOGC_ERROR_TEMPLATE_PARSER:
      __format = "error: template: %s\n";
      break;
    case BLOGC_ERROR_LOADER:
      __format = "error: loader: %s\n";
      break;
    case BLOGC_WARNING_DATETIME_PARSER:
      __format = "warning: datetime: %s\n";
      break;
    default:
      switch(bVar1) {
      case BLOGC_MAKE_ERROR_SETTINGS:
        __format = "error: settings: %s\n";
        break;
      case BLOGC_MAKE_ERROR_EXEC:
        __format = "error: exec: %s\n";
        break;
      case BLOGC_MAKE_ERROR_ATOM:
        __format = "error: atom: %s\n";
        break;
      case BLOGC_MAKE_ERROR_UTILS:
        __format = "error: utils: %s\n";
        break;
      default:
        if (bVar1 == BC_ERROR_CONFIG_PARSER) {
          __format = "error: config-parser: %s\n";
        }
        else if (bVar1 == BC_ERROR_FILE) {
          __format = "error: file: %s\n";
        }
        else {
          __format = "error: %s\n";
        }
      }
    }
    fprintf(_stderr,__format,err->msg);
    return;
  }
  return;
}

Assistant:

void
bc_error_print(bc_error_t *err, const char *prefix)
{
    if (err == NULL)
        return;

    if (prefix != NULL)
        fprintf(stderr, "%s: ", prefix);

    switch(err->type) {
        case BC_ERROR_CONFIG_PARSER:
            fprintf(stderr, "error: config-parser: %s\n", err->msg);
            break;
        case BC_ERROR_FILE:
            fprintf(stderr, "error: file: %s\n", err->msg);
            break;
        case BLOGC_ERROR_SOURCE_PARSER:
            fprintf(stderr, "error: source: %s\n", err->msg);
            break;
        case BLOGC_ERROR_TEMPLATE_PARSER:
            fprintf(stderr, "error: template: %s\n", err->msg);
            break;
        case BLOGC_ERROR_LOADER:
            fprintf(stderr, "error: loader: %s\n", err->msg);
            break;
        case BLOGC_WARNING_DATETIME_PARSER:
            fprintf(stderr, "warning: datetime: %s\n", err->msg);
            break;
        case BLOGC_MAKE_ERROR_SETTINGS:
            fprintf(stderr, "error: settings: %s\n", err->msg);
            break;
        case BLOGC_MAKE_ERROR_EXEC:
            fprintf(stderr, "error: exec: %s\n", err->msg);
            break;
        case BLOGC_MAKE_ERROR_ATOM:
            fprintf(stderr, "error: atom: %s\n", err->msg);
            break;
        case BLOGC_MAKE_ERROR_UTILS:
            fprintf(stderr, "error: utils: %s\n", err->msg);
            break;
        default:
            fprintf(stderr, "error: %s\n", err->msg);
    }
}